

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void print_props(mg_connection *nc,char *name,cs_stat_t *stp)

{
  size_t s_len;
  size_t in_RCX;
  char *pcVar1;
  time_t t;
  char mtime [64];
  char buf [1500];
  
  t = stp->st_mtime;
  gmt_time_string(mtime,0x40,&t);
  s_len = strlen(name);
  mg_url_encode(name,s_len,buf,in_RCX);
  pcVar1 = "";
  if ((stp->st_mode & 0xf000) == 0x4000) {
    pcVar1 = "<d:collection/>";
  }
  mg_printf(nc,
            "<d:response><d:href>%s</d:href><d:propstat><d:prop><d:resourcetype>%s</d:resourcetype><d:getcontentlength>%ld</d:getcontentlength><d:getlastmodified>%s</d:getlastmodified></d:prop><d:status>HTTP/1.1 200 OK</d:status></d:propstat></d:response>\n"
            ,buf,pcVar1,stp->st_size,mtime);
  return;
}

Assistant:

static void print_props(struct mg_connection *nc, const char *name,
                        cs_stat_t *stp) {
    char mtime[64], buf[MAX_PATH_SIZE * 3];
    time_t t = stp->st_mtime; /* store in local variable for NDK compile */
    gmt_time_string(mtime, sizeof(mtime), &t);
    mg_url_encode(name, strlen(name), buf, sizeof(buf));
    mg_printf(nc,
              "<d:response>"
                      "<d:href>%s</d:href>"
                      "<d:propstat>"
                      "<d:prop>"
                      "<d:resourcetype>%s</d:resourcetype>"
                      "<d:getcontentlength>%" INT64_FMT
                      "</d:getcontentlength>"
                      "<d:getlastmodified>%s</d:getlastmodified>"
                      "</d:prop>"
                      "<d:status>HTTP/1.1 200 OK</d:status>"
                      "</d:propstat>"
                      "</d:response>\n",
              buf, S_ISDIR(stp->st_mode) ? "<d:collection/>" : "",
              (int64_t) stp->st_size, mtime);
}